

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateTypeLiteral(ExpressionEvalContext *ctx,ExprTypeLiteral *expression)

{
  Allocator *pAVar1;
  TypeBase *pTVar2;
  TypeBase *pTVar3;
  int iVar4;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  
  pAVar1 = ctx->ctx->allocator;
  iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
  pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
  pTVar2 = expression->value;
  pEVar5->typeID = 8;
  pTVar3 = (expression->super_ExprBase).type;
  pEVar5->source = (expression->super_ExprBase).source;
  pEVar5->type = pTVar3;
  pEVar5->next = (ExprBase *)0x0;
  pEVar5->listed = false;
  pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6550;
  pEVar5[1]._vptr_ExprBase = (_func_int **)pTVar2;
  pEVar5 = CheckType(&expression->super_ExprBase,pEVar5);
  return pEVar5;
}

Assistant:

ExprBase* EvaluateTypeLiteral(ExpressionEvalContext &ctx, ExprTypeLiteral *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, expression->type, expression->value));
}